

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::Increment_q(ChConstraintThreeBBShaft *this,double deltal)

{
  undefined1 auVar1 [16];
  ChVariables *this_00;
  Scalar *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double local_68;
  double local_60;
  double local_58;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_50;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> local_30 [24];
  
  local_68 = deltal;
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
              (&local_50,(MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&this->Eq_a,&local_68);
    ChVariables::Get_qb((ChVectorRef *)local_30,(this->super_ChConstraintThree).variables_a);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
    operator+=(local_30,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                         *)&local_50);
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
              (&local_50,(MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&this->Eq_b,&local_68);
    ChVariables::Get_qb((ChVectorRef *)local_30,(this->super_ChConstraintThree).variables_b);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
    operator+=(local_30,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                         *)&local_50);
  }
  this_00 = (this->super_ChConstraintThree).variables_c;
  if (this_00->disabled == false) {
    local_58 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
               m_data.array[0];
    local_60 = local_68;
    ChVariables::Get_qb((ChVectorRef *)&local_50,this_00);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)&local_50,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_58;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_60;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *pSVar2;
    auVar1 = vfmadd213sd_fma(auVar4,auVar3,auVar1);
    *pSVar2 = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::Increment_q(const double deltal) {
    if (variables_a->IsActive()) {
        variables_a->Get_qb() += Eq_a * deltal;
    }

    if (variables_b->IsActive()) {
        variables_b->Get_qb() += Eq_b * deltal;
    }

    if (variables_c->IsActive()) {
        variables_c->Get_qb()(0) += Eq_c(0) * deltal;
    }
}